

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::NewFrame(void)

{
  ImDrawList *this;
  ImGuiID *pIVar1;
  bool *pbVar2;
  ImVec2 *pIVar3;
  float *pfVar4;
  char cVar5;
  ImGuiID IVar6;
  ImGuiInputSource IVar7;
  ImGuiID IVar8;
  ImFontAtlas *pIVar9;
  char *pcVar10;
  uchar *puVar11;
  ImGuiWindow **ppIVar12;
  ImGuiPopupRef *pIVar13;
  ImVec2 IVar14;
  ImGuiContext *pIVar15;
  ImGuiContext *pIVar16;
  ImGuiContext *pIVar17;
  bool bVar18;
  bool bVar19;
  int i;
  int iVar20;
  long lVar21;
  ImFont *font;
  ImGuiWindow *pIVar22;
  ImGuiWindow **__dest;
  ImGuiPopupRef *__dest_00;
  bool bVar23;
  int i_1;
  ImGuiWindow *parent_window;
  ImGuiWindow *pIVar24;
  ulong uVar25;
  int iVar26;
  ImGuiWindow *window;
  float *pfVar27;
  ulong uVar28;
  ImGuiWindow *pIVar29;
  float *pfVar30;
  ImGuiNavMoveResult *pIVar31;
  ImGuiContext *g_1;
  ImGuiContext *g;
  bool bVar32;
  byte bVar33;
  uint uVar34;
  uint uVar35;
  float fVar36;
  float fVar37;
  ImVec2 IVar38;
  ImVec2 IVar39;
  ImVec2 IVar40;
  float fVar41;
  float fVar42;
  ImVec2 IVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  ImVec2 IVar48;
  float fVar49;
  ImRect local_48;
  ImGuiWindow *local_38;
  
  pIVar15 = GImGui;
  bVar33 = 0;
  if (GImGui == (ImGuiContext *)0x0) {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() or ImGui::SetCurrentContext()?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xd96,"void ImGui::NewFrame()");
  }
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xd9b,"void ImGui::NewFrame()");
  }
  if ((GImGui->IO).DeltaTime < 0.0) {
    __assert_fail("g.IO.DeltaTime >= 0.0f && \"Need a positive DeltaTime (zero is tolerated but will cause some timing issues)\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xd9c,"void ImGui::NewFrame()");
  }
  if (((GImGui->IO).DisplaySize.x < 0.0) || ((GImGui->IO).DisplaySize.y < 0.0)) {
    __assert_fail("g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f && \"Invalid DisplaySize value\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xd9d,"void ImGui::NewFrame()");
  }
  pIVar9 = (GImGui->IO).Fonts;
  if ((pIVar9->Fonts).Size < 1) {
    __assert_fail("g.IO.Fonts->Fonts.Size > 0 && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xd9e,"void ImGui::NewFrame()");
  }
  if ((*(pIVar9->Fonts).Data)->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.IO.Fonts->Fonts[0]->IsLoaded() && \"Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xd9f,"void ImGui::NewFrame()");
  }
  if ((GImGui->Style).CurveTessellationTol <= 0.0) {
    __assert_fail("g.Style.CurveTessellationTol > 0.0f && \"Invalid style setting\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xda0,"void ImGui::NewFrame()");
  }
  fVar36 = (GImGui->Style).Alpha;
  if ((fVar36 < 0.0) || (1.0 < fVar36)) {
    __assert_fail("g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f && \"Invalid style setting. Alpha cannot be negative (allows us to avoid a few clamps in color computations)\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xda1,"void ImGui::NewFrame()");
  }
  if ((GImGui->FrameCount != 0) && (GImGui->FrameCountEnded != GImGui->FrameCount)) {
    __assert_fail("(g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount) && \"Forgot to call Render() or EndFrame() at the end of the previous frame?\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xda2,"void ImGui::NewFrame()");
  }
  lVar21 = 0;
  do {
    if (0x200 < (GImGui->IO).KeyMap[lVar21] + 1U) {
      __assert_fail("g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < ((int)(sizeof(g.IO.KeysDown)/sizeof(*g.IO.KeysDown))) && \"io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0xda4,"void ImGui::NewFrame()");
    }
    lVar21 = lVar21 + 1;
  } while (lVar21 != 0x15);
  if ((((GImGui->IO).ConfigFlags & 1) != 0) && ((GImGui->IO).KeyMap[0xc] == -1)) {
    __assert_fail("g.IO.KeyMap[ImGuiKey_Space] != -1 && \"ImGuiKey_Space is not mapped, required for keyboard navigation.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xda8,"void ImGui::NewFrame()");
  }
  if (GImGui->SettingsLoaded == false) {
    if ((GImGui->SettingsWindows).Size != 0) {
      __assert_fail("g.SettingsWindows.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0xdad,"void ImGui::NewFrame()");
    }
    pcVar10 = (GImGui->IO).IniFilename;
    if (pcVar10 != (char *)0x0) {
      LoadIniSettingsFromDisk(pcVar10);
    }
    pIVar15->SettingsLoaded = true;
  }
  if ((0.0 < pIVar15->SettingsDirtyTimer) &&
     (fVar36 = pIVar15->SettingsDirtyTimer - (pIVar15->IO).DeltaTime,
     pIVar15->SettingsDirtyTimer = fVar36, fVar36 <= 0.0)) {
    pcVar10 = (pIVar15->IO).IniFilename;
    if (pcVar10 == (char *)0x0) {
      (pIVar15->IO).WantSaveIniSettings = true;
    }
    else {
      SaveIniSettingsToDisk(pcVar10);
    }
    pIVar15->SettingsDirtyTimer = 0.0;
  }
  pIVar15->Time = (pIVar15->IO).DeltaTime + pIVar15->Time;
  pIVar15->FrameCount = pIVar15->FrameCount + 1;
  pIVar15->TooltipOverrideCount = 0;
  pIVar15->WindowsActiveCount = 0;
  font = GetDefaultFont();
  SetCurrentFont(font);
  if (pIVar15->Font->ContainerAtlas == (ImFontAtlas *)0x0) {
    __assert_fail("g.Font->IsLoaded()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xdc7,"void ImGui::NewFrame()");
  }
  fVar36 = (pIVar15->IO).DisplaySize.x;
  fVar44 = (pIVar15->IO).DisplaySize.y;
  (pIVar15->DrawListSharedData).ClipRectFullscreen.x = 0.0;
  (pIVar15->DrawListSharedData).ClipRectFullscreen.y = 0.0;
  (pIVar15->DrawListSharedData).ClipRectFullscreen.z = fVar36;
  (pIVar15->DrawListSharedData).ClipRectFullscreen.w = fVar44;
  (pIVar15->DrawListSharedData).CurveTessellationTol = (pIVar15->Style).CurveTessellationTol;
  this = &pIVar15->OverlayDrawList;
  ImDrawList::Clear(this);
  ImDrawList::PushTextureID(this,((pIVar15->IO).Fonts)->TexID);
  ImDrawList::PushClipRectFullScreen(this);
  (pIVar15->OverlayDrawList).Flags =
       (uint)(pIVar15->Style).AntiAliasedLines + (uint)(pIVar15->Style).AntiAliasedFill * 2;
  (pIVar15->DrawData).Valid = false;
  (pIVar15->DrawData).CmdLists = (ImDrawList **)0x0;
  (pIVar15->DrawData).CmdListsCount = 0;
  (pIVar15->DrawData).TotalIdxCount = 0;
  (pIVar15->DrawData).TotalVtxCount = 0;
  if (pIVar15->HoveredIdPreviousFrame == 0) {
    pIVar15->HoveredIdTimer = 0.0;
  }
  pIVar15->HoveredIdPreviousFrame = pIVar15->HoveredId;
  pIVar15->HoveredId = 0;
  pIVar15->HoveredIdAllowOverlap = false;
  pIVar16 = GImGui;
  if ((pIVar15->ActiveIdIsAlive == false) &&
     (pIVar15->ActiveId != 0 && pIVar15->ActiveIdPreviousFrame == pIVar15->ActiveId)) {
    bVar32 = GImGui->ActiveId != 0;
    GImGui->ActiveIdIsJustActivated = bVar32;
    if (bVar32) {
      pIVar16->ActiveIdTimer = 0.0;
    }
    pIVar16->ActiveId = 0;
    pIVar16->ActiveIdAllowNavDirFlags = 0;
    pIVar16->ActiveIdAllowOverlap = false;
    pIVar16->ActiveIdWindow = (ImGuiWindow *)0x0;
  }
  IVar6 = pIVar15->ActiveId;
  if (IVar6 != 0) {
    pIVar15->ActiveIdTimer = (pIVar15->IO).DeltaTime + pIVar15->ActiveIdTimer;
  }
  pIVar15->ActiveIdPreviousFrame = IVar6;
  pIVar15->ActiveIdIsAlive = false;
  pIVar15->ActiveIdIsJustActivated = false;
  if (IVar6 != pIVar15->ScalarAsInputTextId && pIVar15->ScalarAsInputTextId != 0) {
    pIVar15->ScalarAsInputTextId = 0;
  }
  pIVar16 = GImGui;
  if ((pIVar15->DragDropActive == true) &&
     ((pIVar15->DragDropPayload).DataFrameCount + 1 < pIVar15->FrameCount)) {
    GImGui->DragDropActive = false;
    (pIVar16->DragDropPayload).DataType[0] = '\0';
    (pIVar16->DragDropPayload).DataType[1] = '\0';
    (pIVar16->DragDropPayload).DataType[2] = '\0';
    (pIVar16->DragDropPayload).DataType[3] = '\0';
    (pIVar16->DragDropPayload).DataType[4] = '\0';
    (pIVar16->DragDropPayload).DataType[5] = '\0';
    (pIVar16->DragDropPayload).DataType[6] = '\0';
    (pIVar16->DragDropPayload).DataType[7] = '\0';
    (pIVar16->DragDropPayload).DataType[8] = '\0';
    (pIVar16->DragDropPayload).DataType[9] = '\0';
    (pIVar16->DragDropPayload).DataType[10] = '\0';
    (pIVar16->DragDropPayload).DataType[0xb] = '\0';
    (pIVar16->DragDropPayload).DataType[0xc] = '\0';
    (pIVar16->DragDropPayload).DataType[0xd] = '\0';
    (pIVar16->DragDropPayload).DataType[0xe] = '\0';
    (pIVar16->DragDropPayload).DataType[0xf] = '\0';
    (pIVar16->DragDropPayload).DataType[0x10] = '\0';
    (pIVar16->DragDropPayload).DataType[0x11] = '\0';
    (pIVar16->DragDropPayload).DataType[0x12] = '\0';
    (pIVar16->DragDropPayload).DataType[0x13] = '\0';
    (pIVar16->DragDropPayload).DataType[0x14] = '\0';
    (pIVar16->DragDropPayload).DataType[0x15] = '\0';
    (pIVar16->DragDropPayload).DataType[0x16] = '\0';
    (pIVar16->DragDropPayload).DataType[0x17] = '\0';
    (pIVar16->DragDropPayload).DataType[0x18] = '\0';
    (pIVar16->DragDropPayload).DataType[0x19] = '\0';
    (pIVar16->DragDropPayload).DataType[0x1a] = '\0';
    (pIVar16->DragDropPayload).DataType[0x1b] = '\0';
    (pIVar16->DragDropPayload).DataType[0x1c] = '\0';
    (pIVar16->DragDropPayload).DataType[0x1d] = '\0';
    (pIVar16->DragDropPayload).DataType[0x1e] = '\0';
    (pIVar16->DragDropPayload).DataType[0x1f] = '\0';
    (pIVar16->DragDropPayload).DataType[0x20] = '\0';
    (pIVar16->DragDropPayload).Data = (void *)0x0;
    (pIVar16->DragDropPayload).DataSize = 0;
    (pIVar16->DragDropPayload).SourceId = 0;
    (pIVar16->DragDropPayload).SourceParentId = 0;
    (pIVar16->DragDropPayload).DataFrameCount = -1;
    (pIVar16->DragDropPayload).Preview = false;
    (pIVar16->DragDropPayload).Delivery = false;
    pIVar16->DragDropAcceptIdPrev = 0;
    pIVar16->DragDropAcceptFrameCount = -1;
    pIVar16->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
    pIVar16->DragDropAcceptIdCurr = 0;
    puVar11 = (pIVar15->DragDropPayloadBufHeap).Data;
    if (puVar11 != (uchar *)0x0) {
      (pIVar15->DragDropPayloadBufHeap).Size = 0;
      (pIVar15->DragDropPayloadBufHeap).Capacity = 0;
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      (*GImAllocatorFreeFunc)(puVar11,GImAllocatorUserData);
      (pIVar15->DragDropPayloadBufHeap).Data = (uchar *)0x0;
    }
    pIVar15->DragDropPayloadBufLocal[0] = '\0';
    pIVar15->DragDropPayloadBufLocal[1] = '\0';
    pIVar15->DragDropPayloadBufLocal[2] = '\0';
    pIVar15->DragDropPayloadBufLocal[3] = '\0';
    pIVar15->DragDropPayloadBufLocal[4] = '\0';
    pIVar15->DragDropPayloadBufLocal[5] = '\0';
    pIVar15->DragDropPayloadBufLocal[6] = '\0';
    pIVar15->DragDropPayloadBufLocal[7] = '\0';
  }
  pIVar15->DragDropAcceptIdPrev = pIVar15->DragDropAcceptIdCurr;
  pIVar15->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
  pIVar15->DragDropAcceptIdCurr = 0;
  pfVar4 = (pIVar15->IO).KeysDownDuration;
  memcpy((pIVar15->IO).KeysDownDurationPrev,pfVar4,0x800);
  lVar21 = 0;
  do {
    fVar36 = -1.0;
    if ((pIVar15->IO).KeysDown[lVar21] == true) {
      fVar36 = 0.0;
      if (0.0 <= pfVar4[lVar21]) {
        fVar36 = pfVar4[lVar21] + (pIVar15->IO).DeltaTime;
      }
    }
    pfVar4[lVar21] = fVar36;
    pIVar16 = GImGui;
    lVar21 = lVar21 + 1;
  } while (lVar21 != 0x200);
  (GImGui->IO).WantSetMousePos = false;
  uVar34 = (pIVar16->IO).ConfigFlags;
  if ((((uVar34 & 2) != 0) && (((pIVar16->IO).BackendFlags & 1) != 0)) &&
     ((0.0 < (pIVar16->IO).NavInputs[0] ||
      (((0.0 < (pIVar16->IO).NavInputs[2] || (0.0 < (pIVar16->IO).NavInputs[1])) ||
       (0.0 < (pIVar16->IO).NavInputs[3])))))) {
    pIVar16->NavInputSource = ImGuiInputSource_NavGamepad;
  }
  if ((uVar34 & 1) != 0) {
    iVar26 = (pIVar16->IO).KeyMap[0xc];
    if (-1 < (long)iVar26) {
      if (0x1ff < iVar26) goto LAB_00143398;
      if ((pIVar16->IO).KeysDown[iVar26] == true) {
        (pIVar16->IO).NavInputs[0] = 1.0;
        pIVar16->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar26 = (pIVar16->IO).KeyMap[0xd];
    if (-1 < (long)iVar26) {
      if (0x1ff < iVar26) goto LAB_00143398;
      if ((pIVar16->IO).KeysDown[iVar26] == true) {
        (pIVar16->IO).NavInputs[2] = 1.0;
        pIVar16->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar26 = (pIVar16->IO).KeyMap[0xe];
    if (-1 < (long)iVar26) {
      if (0x1ff < iVar26) goto LAB_00143398;
      if ((pIVar16->IO).KeysDown[iVar26] == true) {
        (pIVar16->IO).NavInputs[1] = 1.0;
        pIVar16->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar26 = (pIVar16->IO).KeyMap[1];
    if (-1 < (long)iVar26) {
      if (0x1ff < iVar26) goto LAB_00143398;
      if ((pIVar16->IO).KeysDown[iVar26] == true) {
        (pIVar16->IO).NavInputs[0x11] = 1.0;
        pIVar16->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar26 = (pIVar16->IO).KeyMap[2];
    if (-1 < (long)iVar26) {
      if (0x1ff < iVar26) goto LAB_00143398;
      if ((pIVar16->IO).KeysDown[iVar26] == true) {
        (pIVar16->IO).NavInputs[0x12] = 1.0;
        pIVar16->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar26 = (pIVar16->IO).KeyMap[3];
    if (-1 < (long)iVar26) {
      if (0x1ff < iVar26) goto LAB_00143398;
      if ((pIVar16->IO).KeysDown[iVar26] == true) {
        (pIVar16->IO).NavInputs[0x13] = 1.0;
        pIVar16->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    iVar26 = (pIVar16->IO).KeyMap[4];
    if (-1 < (long)iVar26) {
      if (0x1ff < iVar26) {
LAB_00143398:
        __assert_fail("user_key_index >= 0 && user_key_index < ((int)(sizeof(GImGui->IO.KeysDown)/sizeof(*GImGui->IO.KeysDown)))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                      ,0x120f,"bool ImGui::IsKeyDown(int)");
      }
      if ((pIVar16->IO).KeysDown[iVar26] == true) {
        (pIVar16->IO).NavInputs[0x14] = 1.0;
        pIVar16->NavInputSource = ImGuiInputSource_NavKeyboard;
      }
    }
    if ((pIVar16->IO).KeyCtrl == true) {
      (pIVar16->IO).NavInputs[0xe] = 1.0;
    }
    if ((pIVar16->IO).KeyShift == true) {
      (pIVar16->IO).NavInputs[0xf] = 1.0;
    }
    if ((pIVar16->IO).KeyAlt == true) {
      (pIVar16->IO).NavInputs[0x10] = 1.0;
    }
  }
  pfVar4 = (pIVar16->IO).NavInputsDownDuration;
  pfVar27 = pfVar4;
  pfVar30 = (pIVar16->IO).NavInputsDownDurationPrev;
  for (lVar21 = 0x15; lVar21 != 0; lVar21 = lVar21 + -1) {
    *pfVar30 = *pfVar27;
    pfVar27 = pfVar27 + (ulong)bVar33 * -2 + 1;
    pfVar30 = pfVar30 + (ulong)bVar33 * -2 + 1;
  }
  lVar21 = 0;
  do {
    fVar36 = -1.0;
    if (0.0 < (pIVar16->IO).NavInputs[lVar21]) {
      fVar36 = 0.0;
      if (0.0 <= pfVar4[lVar21]) {
        fVar36 = pfVar4[lVar21] + (pIVar16->IO).DeltaTime;
      }
    }
    pfVar4[lVar21] = fVar36;
    lVar21 = lVar21 + 1;
  } while (lVar21 != 0x15);
  IVar6 = pIVar16->NavInitResultId;
  if ((IVar6 != 0) &&
     ((pIVar16->NavDisableHighlight != true || (pIVar16->NavInitRequestFromMove == true)))) {
    if (pIVar16->NavWindow == (ImGuiWindow *)0x0) {
      __assert_fail("g.NavWindow",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0xc08,"void ImGui::NavUpdate()");
    }
    iVar26 = pIVar16->NavLayer;
    if (pIVar16->NavInitRequestFromMove == true) {
      SetNavID(IVar6,iVar26);
      IVar38 = (pIVar16->NavInitResultRectRel).Max;
      pIVar3 = &pIVar16->NavWindow->NavRectRel[iVar26].Min;
      *pIVar3 = (pIVar16->NavInitResultRectRel).Min;
      pIVar3[1] = IVar38;
      pIVar16->NavMousePosDirty = true;
      pIVar16->NavDisableHighlight = false;
      pIVar16->NavDisableMouseHover = true;
    }
    else {
      SetNavID(IVar6,iVar26);
    }
    IVar38 = (pIVar16->NavInitResultRectRel).Max;
    pIVar3 = &pIVar16->NavWindow->NavRectRel[pIVar16->NavLayer].Min;
    *pIVar3 = (pIVar16->NavInitResultRectRel).Min;
    pIVar3[1] = IVar38;
  }
  pIVar16->NavInitRequest = false;
  pIVar16->NavInitRequestFromMove = false;
  pIVar16->NavInitResultId = 0;
  pIVar16->NavJustMovedToId = 0;
  if ((pIVar16->NavMoveRequest == true) &&
     ((IVar6 = (pIVar16->NavMoveResultLocal).ID, IVar6 != 0 ||
      ((pIVar16->NavMoveResultOther).ID != 0)))) {
    pIVar31 = &pIVar16->NavMoveResultLocal;
    if (IVar6 == 0) {
      pIVar31 = &pIVar16->NavMoveResultOther;
    }
    if (((pIVar16->NavMoveResultOther).ID != 0) &&
       (((pIVar16->NavMoveResultOther).Window)->ParentWindow == pIVar16->NavWindow)) {
      fVar36 = (pIVar16->NavMoveResultLocal).DistBox;
      fVar44 = (pIVar16->NavMoveResultOther).DistBox;
      if (fVar36 <= fVar44) {
        if (((fVar44 != fVar36) || (NAN(fVar44) || NAN(fVar36))) ||
           (fVar36 = (pIVar16->NavMoveResultLocal).DistCenter,
           pfVar4 = &(pIVar16->NavMoveResultOther).DistCenter, fVar36 < *pfVar4 || fVar36 == *pfVar4
           )) goto LAB_001416b5;
      }
      pIVar31 = &pIVar16->NavMoveResultOther;
    }
LAB_001416b5:
    if ((pIVar16->NavWindow == (ImGuiWindow *)0x0) ||
       (pIVar22 = pIVar31->Window, pIVar22 == (ImGuiWindow *)0x0)) {
      __assert_fail("g.NavWindow && result->Window",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0xc1d,"void ImGui::NavUpdate()");
    }
    if (pIVar16->NavLayer == 0) {
      fVar36 = (pIVar22->Pos).x;
      fVar44 = (pIVar22->Pos).y;
      local_48.Min.x = (pIVar31->RectRel).Min.x + fVar36;
      local_48.Min.y = (pIVar31->RectRel).Min.y + fVar44;
      local_48.Max.x = fVar36 + (pIVar31->RectRel).Max.x;
      local_48.Max.y = fVar44 + (pIVar31->RectRel).Max.y;
      NavScrollToBringItemIntoView(pIVar22,&local_48);
      if ((pIVar31->Window->Flags & 0x1000000) != 0) {
        NavScrollToBringItemIntoView(pIVar31->Window->ParentWindow,&local_48);
      }
      pIVar22 = pIVar31->Window;
      IVar38 = CalcNextScrollFromScrollTargetAndClamp(pIVar22,false);
      fVar36 = (pIVar22->Scroll).x - IVar38.x;
      fVar44 = (pIVar22->Scroll).y - IVar38.y;
      (pIVar31->RectRel).Min.x = (pIVar31->RectRel).Min.x + fVar36;
      (pIVar31->RectRel).Min.y = (pIVar31->RectRel).Min.y + fVar44;
      (pIVar31->RectRel).Max.x = fVar36 + (pIVar31->RectRel).Max.x;
      (pIVar31->RectRel).Max.y = fVar44 + (pIVar31->RectRel).Max.y;
    }
    pIVar17 = GImGui;
    bVar32 = GImGui->ActiveId != 0;
    GImGui->ActiveIdIsJustActivated = bVar32;
    if (bVar32) {
      pIVar17->ActiveIdTimer = 0.0;
    }
    pIVar17->ActiveId = 0;
    pIVar17->ActiveIdAllowNavDirFlags = 0;
    pIVar17->ActiveIdAllowOverlap = false;
    pIVar17->ActiveIdWindow = (ImGuiWindow *)0x0;
    pIVar16->NavWindow = pIVar31->Window;
    iVar26 = pIVar16->NavLayer;
    SetNavID(pIVar31->ID,iVar26);
    IVar38 = (pIVar31->RectRel).Max;
    pIVar3 = &pIVar17->NavWindow->NavRectRel[iVar26].Min;
    *pIVar3 = (pIVar31->RectRel).Min;
    pIVar3[1] = IVar38;
    pIVar17->NavMousePosDirty = true;
    pIVar17->NavDisableHighlight = false;
    pIVar17->NavDisableMouseHover = true;
    pIVar16->NavJustMovedToId = pIVar31->ID;
    pIVar16->NavMoveFromClampedRefRect = false;
  }
  if (pIVar16->NavMoveRequestForward == ImGuiNavForward_ForwardActive) {
    if (pIVar16->NavMoveRequest == false) {
      __assert_fail("g.NavMoveRequest",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0xc37,"void ImGui::NavUpdate()");
    }
    if (((pIVar16->NavMoveResultLocal).ID == 0) && ((pIVar16->NavMoveResultOther).ID == 0)) {
      pIVar16->NavDisableHighlight = false;
    }
    pIVar16->NavMoveRequestForward = ImGuiNavForward_None;
  }
  if ((pIVar16->NavMousePosDirty == true) && (pIVar16->NavIdIsAlive == true)) {
    if ((((pIVar16->IO).ConfigFlags & 4) != 0) && (((pIVar16->IO).BackendFlags & 4) != 0)) {
      if ((pIVar16->NavDisableHighlight != false) || (pIVar16->NavDisableMouseHover == false)) {
        __assert_fail("!g.NavDisableHighlight && g.NavDisableMouseHover",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                      ,0xc43,"void ImGui::NavUpdate()");
      }
      IVar38 = NavCalcPreferredRefPos();
      (pIVar16->IO).MousePosPrev = IVar38;
      (pIVar16->IO).MousePos = IVar38;
      (pIVar16->IO).WantSetMousePos = true;
    }
    pIVar16->NavMousePosDirty = false;
  }
  pIVar16->NavIdIsAlive = false;
  pIVar16->NavJustTabbedId = 0;
  uVar34 = pIVar16->NavLayer;
  if (1 < uVar34) {
    __assert_fail("g.NavLayer == 0 || g.NavLayer == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xc4b,"void ImGui::NavUpdate()");
  }
  pIVar22 = pIVar16->NavWindow;
  pIVar24 = pIVar22;
  if (pIVar22 != (ImGuiWindow *)0x0) {
    do {
      if ((pIVar24->Flags & 0x15000000U) != 0x1000000) {
        if (pIVar24 != pIVar22) {
          pIVar24->NavLastChildNavWindow = pIVar22;
        }
        break;
      }
      ppIVar12 = &pIVar24->ParentWindow;
      pIVar24 = *ppIVar12;
    } while (*ppIVar12 != (ImGuiWindow *)0x0);
    if (((pIVar22 != (ImGuiWindow *)0x0) && (uVar34 == 0)) &&
       (pIVar22->NavLastChildNavWindow != (ImGuiWindow *)0x0)) {
      pIVar22->NavLastChildNavWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar17 = GImGui;
  if (GImGui->NavWindowingTarget == (ImGuiWindow *)0x0) {
    bVar32 = (GImGui->IO).NavInputsDownDuration[3] == 0.0;
    if ((((GImGui->IO).KeyCtrl != true) || (iVar26 = (GImGui->IO).KeyMap[0], iVar26 < 0)) ||
       (bVar18 = IsKeyPressed(iVar26,true), !bVar18)) goto LAB_001419c2;
    bVar33 = (byte)(pIVar17->IO).ConfigFlags & 1;
  }
  else {
    bVar32 = false;
LAB_001419c2:
    bVar33 = 0;
  }
  if (bVar32 || bVar33 != 0) {
    pIVar22 = pIVar17->NavWindow;
    if (pIVar22 == (ImGuiWindow *)0x0) {
      pIVar22 = FindWindowNavigable((pIVar17->Windows).Size + -1,-0x7fffffff,-1);
    }
    if (pIVar22 != (ImGuiWindow *)0x0) {
      pIVar17->NavWindowingTarget = pIVar22->RootWindowForTabbing;
      pIVar17->NavWindowingHighlightTimer = 0.0;
      pIVar17->NavWindowingHighlightAlpha = 0.0;
      pIVar17->NavWindowingToggleLayer = (bool)(bVar33 ^ 1);
      pIVar17->NavInputSource = ImGuiInputSource_NavGamepad - bVar33;
    }
  }
  fVar36 = (pIVar17->IO).DeltaTime + pIVar17->NavWindowingHighlightTimer;
  pIVar17->NavWindowingHighlightTimer = fVar36;
  if ((pIVar17->NavWindowingTarget == (ImGuiWindow *)0x0) ||
     (pIVar17->NavInputSource != ImGuiInputSource_NavGamepad)) {
LAB_00141b22:
    bVar32 = false;
    pIVar22 = (ImGuiWindow *)0x0;
  }
  else {
    fVar44 = (fVar36 + -0.2) / 0.05;
    fVar36 = 1.0;
    if (fVar44 <= 1.0) {
      fVar36 = fVar44;
    }
    fVar36 = (float)(~-(uint)(fVar44 < 0.0) & (uint)fVar36);
    uVar34 = -(uint)(fVar36 <= pIVar17->NavWindowingHighlightAlpha);
    pIVar17->NavWindowingHighlightAlpha =
         (float)(uVar34 & (uint)pIVar17->NavWindowingHighlightAlpha | ~uVar34 & (uint)fVar36);
    fVar36 = GetNavInputAmount(0xc,ImGuiInputReadMode_RepeatSlow);
    fVar44 = GetNavInputAmount(0xd,ImGuiInputReadMode_RepeatSlow);
    iVar26 = (uint)(0.0 < fVar36) - (uint)(0.0 < fVar44);
    if (iVar26 != 0) {
      NavUpdateWindowingHighlightWindow(iVar26);
      pIVar17->NavWindowingHighlightAlpha = 1.0;
    }
    if (0.0 < (GImGui->IO).NavInputs[3]) goto LAB_00141b22;
    pbVar2 = &pIVar17->NavWindowingToggleLayer;
    *pbVar2 = (bool)(*pbVar2 &
                    (pIVar17->NavWindowingHighlightAlpha <= 1.0 &&
                    pIVar17->NavWindowingHighlightAlpha != 1.0));
    if (*pbVar2 == false) {
      pIVar22 = pIVar17->NavWindowingTarget;
      bVar32 = false;
    }
    else {
      bVar32 = pIVar17->NavWindow != (ImGuiWindow *)0x0;
      pIVar22 = (ImGuiWindow *)0x0;
    }
    pIVar17->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((pIVar17->NavWindowingTarget != (ImGuiWindow *)0x0) &&
     (pIVar17->NavInputSource == ImGuiInputSource_NavKeyboard)) {
    fVar44 = (pIVar17->NavWindowingHighlightTimer + -0.15) / 0.04;
    fVar36 = 1.0;
    if (fVar44 <= 1.0) {
      fVar36 = fVar44;
    }
    fVar36 = (float)(~-(uint)(fVar44 < 0.0) & (uint)fVar36);
    uVar34 = -(uint)(fVar36 <= pIVar17->NavWindowingHighlightAlpha);
    pIVar17->NavWindowingHighlightAlpha =
         (float)(uVar34 & (uint)pIVar17->NavWindowingHighlightAlpha | ~uVar34 & (uint)fVar36);
    iVar26 = (GImGui->IO).KeyMap[0];
    if ((-1 < iVar26) && (bVar18 = IsKeyPressed(iVar26,true), bVar18)) {
      NavUpdateWindowingHighlightWindow((pIVar17->IO).KeyShift - 1 | 1);
    }
    if ((pIVar17->IO).KeyCtrl == false) {
      pIVar22 = pIVar17->NavWindowingTarget;
    }
  }
  bVar18 = bVar32;
  if ((((pIVar17->ActiveId == 0) || (pIVar17->ActiveIdAllowOverlap == true)) &&
      (pfVar4 = (GImGui->IO).NavInputsDownDuration + 0x10, *pfVar4 <= 0.0 && *pfVar4 != 0.0)) &&
     (0.0 <= (GImGui->IO).NavInputsDownDurationPrev[0x10])) {
    if (-256000.0 <= (pIVar17->IO).MousePos.x) {
      bVar19 = -256000.0 <= (pIVar17->IO).MousePos.y;
    }
    else {
      bVar19 = false;
    }
    if (-256000.0 <= (pIVar17->IO).MousePosPrev.x) {
      bVar23 = -256000.0 <= (pIVar17->IO).MousePosPrev.y;
    }
    else {
      bVar23 = false;
    }
    bVar18 = true;
    if (bVar19 != bVar23) {
      bVar18 = bVar32;
    }
  }
  pIVar24 = pIVar17->NavWindowingTarget;
  if ((pIVar24 != (ImGuiWindow *)0x0) && (uVar34 = pIVar24->Flags, (uVar34 & 4) == 0)) {
    IVar7 = pIVar17->NavInputSource;
    IVar38.x = 0.0;
    IVar38.y = 0.0;
    if ((IVar7 == ImGuiInputSource_NavKeyboard) && ((pIVar17->IO).KeyShift == false)) {
      local_38 = pIVar22;
      IVar38 = GetNavInputAmount2d(1,ImGuiInputReadMode_Down,0.0,0.0);
      pIVar22 = local_38;
    }
    if (IVar7 == ImGuiInputSource_NavGamepad) {
      IVar38 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.0,0.0);
    }
    fVar36 = IVar38.y;
    if (((IVar38.x != 0.0) || (fVar36 != 0.0)) || (NAN(fVar36))) {
      fVar44 = (pIVar17->IO).DisplayFramebufferScale.x;
      fVar37 = (pIVar17->IO).DisplayFramebufferScale.y;
      if (fVar37 <= fVar44) {
        fVar44 = fVar37;
      }
      fVar44 = (float)(int)(fVar44 * (pIVar17->IO).DeltaTime * 800.0);
      (pIVar24->Pos).x = IVar38.x * fVar44 + (pIVar24->Pos).x;
      (pIVar24->Pos).y = fVar36 * fVar44 + (pIVar24->Pos).y;
      pIVar17->NavDisableMouseHover = true;
      if (((uVar34 >> 8 & 1) == 0) && (GImGui->SettingsDirtyTimer <= 0.0)) {
        GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
      }
    }
  }
  if (pIVar22 != (ImGuiWindow *)0x0) {
    if ((pIVar17->NavWindow == (ImGuiWindow *)0x0) ||
       (pIVar22 != pIVar17->NavWindow->RootWindowForTabbing)) {
      pIVar17->NavDisableHighlight = false;
      pIVar17->NavDisableMouseHover = true;
      pIVar24 = pIVar22->NavLastChildNavWindow;
      if (pIVar22->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
        pIVar24 = pIVar22;
      }
      ClosePopupsOverWindow(pIVar24);
      FocusWindow(pIVar24);
      if (pIVar24->NavLastIds[0] == 0) {
        NavInitWindow(pIVar24,false);
      }
      if ((pIVar24->DC).NavLayerActiveMask == 2) {
        pIVar17->NavLayer = 1;
      }
    }
    pIVar17->NavWindowingTarget = (ImGuiWindow *)0x0;
  }
  if ((bVar18) && (pIVar22 = pIVar17->NavWindow, pIVar22 != (ImGuiWindow *)0x0)) {
    bVar33 = (byte)(pIVar22->DC).NavLayerActiveMask;
    pIVar24 = pIVar22;
    while (((bVar33 & 2) == 0 && ((pIVar24->Flags & 0x15000000U) == 0x1000000))) {
      pIVar24 = pIVar24->ParentWindow;
      bVar33 = (byte)(pIVar24->DC).NavLayerActiveMask;
    }
    if (pIVar24 != pIVar22) {
      FocusWindow(pIVar24);
      pIVar24->NavLastChildNavWindow = pIVar22;
    }
    pIVar17->NavDisableHighlight = false;
    pIVar17->NavDisableMouseHover = true;
    uVar34 = 0;
    if (((pIVar17->NavWindow->DC).NavLayerActiveMask & 2) != 0) {
      uVar34 = pIVar17->NavLayer ^ 1;
    }
    NavRestoreLayer(uVar34);
  }
  uVar34 = (pIVar16->IO).ConfigFlags;
  if ((uVar34 & 2) == 0) {
    bVar33 = 0;
  }
  else {
    bVar33 = (byte)(pIVar16->IO).BackendFlags & 1;
  }
  if ((((uVar34 & 1) == 0) && (bVar33 == 0)) || (pIVar16->NavWindow == (ImGuiWindow *)0x0)) {
    (pIVar16->IO).NavActive = false;
LAB_00141f2b:
    bVar32 = true;
    if (pIVar16->NavWindowingTarget == (ImGuiWindow *)0x0) {
      bVar32 = pIVar16->NavInitRequest;
    }
  }
  else {
    bVar32 = (pIVar16->NavWindow->Flags & 0x40000U) == 0;
    (pIVar16->IO).NavActive = bVar32;
    if (((!bVar32) || (pIVar16->NavId == 0)) ||
       (bVar32 = true, pIVar16->NavDisableHighlight != false)) goto LAB_00141f2b;
  }
  (pIVar16->IO).NavVisible = bVar32;
  pIVar17 = GImGui;
  fVar36 = (GImGui->IO).NavInputsDownDuration[1];
  if ((fVar36 == 0.0) && (!NAN(fVar36))) {
    if (pIVar16->ActiveId == 0) {
      pIVar22 = pIVar16->NavWindow;
      if (((pIVar22 == (ImGuiWindow *)0x0) || ((pIVar22->Flags & 0x5000000U) != 0x1000000)) ||
         (pIVar22->ParentWindow == (ImGuiWindow *)0x0)) {
        iVar26 = (pIVar16->OpenPopupStack).Size;
        if ((long)iVar26 < 1) {
          if (pIVar16->NavLayer == 0) {
            if ((pIVar22 != (ImGuiWindow *)0x0) && ((pIVar22->Flags & 0x5000000U) != 0x1000000)) {
              pIVar22->NavLastIds[0] = 0;
            }
            pIVar16->NavId = 0;
          }
          else {
            NavRestoreLayer(0);
          }
        }
        else if ((((pIVar16->OpenPopupStack).Data[(long)iVar26 + -1].Window)->Flags & 0x8000000) ==
                 0) {
          ClosePopupToLevel(iVar26 + -1);
        }
      }
      else {
        if (pIVar22->ChildId == 0) {
          __assert_fail("child_window->ChildId != 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                        ,0xc67,"void ImGui::NavUpdate()");
        }
        FocusWindow(pIVar22->ParentWindow);
        ppIVar12 = &GImGui->NavWindow;
        if (*ppIVar12 == (ImGuiWindow *)0x0) {
          __assert_fail("g.NavWindow",
                        "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                        ,0x81b,"void SetNavID(ImGuiID, int)");
        }
        IVar6 = pIVar22->ChildId;
        GImGui->NavId = IVar6;
        (*ppIVar12)->NavLastIds[0] = IVar6;
        pIVar16->NavIdIsAlive = false;
        if (pIVar16->NavDisableMouseHover == true) {
          pIVar16->NavMousePosDirty = true;
        }
      }
    }
    else {
      bVar32 = GImGui->ActiveId != 0;
      GImGui->ActiveIdIsJustActivated = bVar32;
      if (bVar32) {
        pIVar17->ActiveIdTimer = 0.0;
      }
      pIVar17->ActiveId = 0;
      pIVar17->ActiveIdAllowNavDirFlags = 0;
      pIVar17->ActiveIdAllowOverlap = false;
      pIVar17->ActiveIdWindow = (ImGuiWindow *)0x0;
    }
  }
  pIVar16->NavActivateId = 0;
  pIVar16->NavActivateDownId = 0;
  pIVar16->NavActivatePressedId = 0;
  pIVar17 = GImGui;
  pIVar16->NavInputId = 0;
  IVar6 = pIVar16->NavId;
  if (((IVar6 != 0) && (pIVar16->NavDisableHighlight == false)) &&
     ((pIVar16->NavWindowingTarget == (ImGuiWindow *)0x0 &&
      ((pIVar16->NavWindow != (ImGuiWindow *)0x0 && ((pIVar16->NavWindow->Flags & 0x40000) == 0)))))
     ) {
    fVar36 = (GImGui->IO).NavInputs[0];
    if (0.0 < fVar36) {
      bVar32 = (GImGui->IO).NavInputsDownDuration[0] == 0.0;
    }
    else {
      bVar32 = false;
    }
    IVar8 = pIVar16->ActiveId;
    if (bVar32 && IVar8 == 0) {
      pIVar16->NavActivateId = IVar6;
    }
    if (IVar8 == 0) {
      if (0.0 < fVar36) goto LAB_001432d5;
    }
    else if (IVar8 == IVar6 && 0.0 < fVar36) {
LAB_001432d5:
      pIVar16->NavActivateDownId = IVar6;
    }
    if (IVar8 == 0) {
      if (bVar32) goto LAB_001432eb;
    }
    else if ((bool)(bVar32 & IVar8 == IVar6)) {
LAB_001432eb:
      pIVar16->NavActivatePressedId = IVar6;
    }
    if (((IVar8 == 0 || IVar8 == IVar6) &&
        (fVar36 = (pIVar17->IO).NavInputsDownDuration[2], fVar36 == 0.0)) && (!NAN(fVar36))) {
      pIVar16->NavInputId = IVar6;
    }
  }
  pIVar22 = pIVar16->NavWindow;
  if ((pIVar22 != (ImGuiWindow *)0x0) && ((pIVar22->Flags & 0x40000) != 0)) {
    pIVar16->NavDisableHighlight = true;
  }
  IVar8 = pIVar16->NavActivateId;
  if ((IVar8 != 0) && (pIVar16->NavActivateDownId != IVar8)) {
    __assert_fail("g.NavActivateDownId == g.NavActivateId",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xc94,"void ImGui::NavUpdate()");
  }
  pIVar16->NavMoveRequest = false;
  IVar8 = pIVar16->NavNextActivateId;
  if (IVar8 != 0) {
    pIVar16->NavInputId = IVar8;
    pIVar16->NavActivatePressedId = IVar8;
    pIVar16->NavActivateDownId = IVar8;
    pIVar16->NavActivateId = IVar8;
  }
  pIVar16->NavNextActivateId = 0;
  if (pIVar16->ActiveId == 0) {
    uVar34 = 0xffffffff;
  }
  else {
    uVar34 = pIVar16->ActiveIdAllowNavDirFlags;
  }
  if (pIVar16->NavMoveRequestForward == ImGuiNavForward_None) {
    pIVar16->NavMoveDir = -1;
    pIVar16->NavMoveRequestFlags = 0;
    if (((pIVar22 != (ImGuiWindow *)0x0) &&
        (uVar34 != 0 && pIVar16->NavWindowingTarget == (ImGuiWindow *)0x0)) &&
       ((pIVar22->Flags & 0x40000) == 0)) {
      if ((uVar34 & 1) != 0) {
        fVar36 = GetNavInputAmount(4,ImGuiInputReadMode_Repeat);
        fVar44 = GetNavInputAmount(0x11,ImGuiInputReadMode_Repeat);
        if (0.0 < fVar44 + fVar36) {
          pIVar16->NavMoveDir = 0;
        }
      }
      if ((uVar34 & 2) != 0) {
        fVar36 = GetNavInputAmount(5,ImGuiInputReadMode_Repeat);
        fVar44 = GetNavInputAmount(0x12,ImGuiInputReadMode_Repeat);
        if (0.0 < fVar44 + fVar36) {
          pIVar16->NavMoveDir = 1;
        }
      }
      if ((uVar34 & 4) != 0) {
        fVar36 = GetNavInputAmount(6,ImGuiInputReadMode_Repeat);
        fVar44 = GetNavInputAmount(0x13,ImGuiInputReadMode_Repeat);
        if (0.0 < fVar44 + fVar36) {
          pIVar16->NavMoveDir = 2;
        }
      }
      if ((uVar34 & 8) != 0) {
        fVar36 = GetNavInputAmount(7,ImGuiInputReadMode_Repeat);
        fVar44 = GetNavInputAmount(0x14,ImGuiInputReadMode_Repeat);
        if (0.0 < fVar44 + fVar36) {
          pIVar16->NavMoveDir = 3;
        }
      }
    }
    pIVar16->NavMoveClipDir = pIVar16->NavMoveDir;
  }
  else {
    if ((pIVar16->NavMoveDir == -1) || (pIVar16->NavMoveClipDir == -1)) {
      __assert_fail("g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0xcaf,"void ImGui::NavUpdate()");
    }
    if (pIVar16->NavMoveRequestForward != ImGuiNavForward_ForwardQueued) {
      __assert_fail("g.NavMoveRequestForward == ImGuiNavForward_ForwardQueued",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0xcb0,"void ImGui::NavUpdate()");
    }
    pIVar16->NavMoveRequestForward = ImGuiNavForward_ForwardActive;
  }
  uVar34 = pIVar16->NavMoveDir;
  if (uVar34 != 0xffffffff) {
    pIVar16->NavMoveRequest = true;
    pIVar16->NavMoveDirLast = uVar34;
  }
  bVar32 = pIVar16->NavMoveRequest;
  if (bVar32 == true && IVar6 == 0) {
    pIVar16->NavInitRequest = true;
    pIVar16->NavInitRequestFromMove = true;
    pIVar16->NavInitResultId = 0;
    pIVar16->NavDisableHighlight = false;
  }
  pIVar17 = GImGui;
  if (GImGui->NavMoveRequest == false) {
    pbVar2 = &GImGui->NavInitRequest;
    GImGui->NavAnyRequest = *pbVar2;
    if (*pbVar2 != false) goto LAB_00142270;
  }
  else {
    GImGui->NavAnyRequest = true;
LAB_00142270:
    if (pIVar17->NavWindow == (ImGuiWindow *)0x0) {
      __assert_fail("g.NavWindow != __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                    ,0x95f,"void NavUpdateAnyRequestFlag()");
    }
  }
  if (((pIVar22 != (ImGuiWindow *)0x0) && ((pIVar22->Flags & 0x40000) == 0)) &&
     (pIVar16->NavWindowingTarget == (ImGuiWindow *)0x0)) {
    fVar36 = (float)(int)(pIVar17->FontBaseSize * pIVar22->FontWindowScale * 100.0 *
                          (pIVar16->IO).DeltaTime + 0.5);
    if (((pIVar22->DC).NavLayerActiveMask == 0) && (((pIVar22->DC).NavHasScroll & bVar32) == 1)) {
      if (uVar34 < 2) {
        fVar44 = (pIVar22->Scroll).x;
        fVar37 = (pIVar22->DC).CursorMaxPos.x;
        fVar41 = (float)(int)(*(float *)(&DAT_001ad0d8 + (ulong)(uVar34 == 0) * 4) * fVar36 + fVar44
                             );
        (pIVar22->Scroll).x = fVar41;
        (pIVar22->DC).CursorMaxPos.x = (fVar44 + fVar37) - fVar41;
      }
      if ((uVar34 & 0xfffffffe) == 2) {
        fVar44 = (pIVar22->Scroll).y;
        fVar37 = (pIVar22->DC).CursorMaxPos.y;
        fVar41 = (float)(int)(*(float *)(&DAT_001ad0d8 + (ulong)(uVar34 == 2) * 4) * fVar36 + fVar44
                             );
        (pIVar22->Scroll).y = fVar41;
        (pIVar22->DC).CursorMaxPos.y = (fVar44 + fVar37) - fVar41;
      }
    }
    IVar38 = GetNavInputAmount2d(4,ImGuiInputReadMode_Down,0.1,10.0);
    fVar44 = IVar38.x;
    fVar37 = IVar38.y;
    if (((fVar44 != 0.0) || (NAN(fVar44))) && (pIVar22->ScrollbarX == true)) {
      fVar41 = (pIVar22->Scroll).x;
      fVar45 = (float)(int)(fVar44 * fVar36 + fVar41);
      fVar44 = (pIVar22->DC).CursorMaxPos.x;
      (pIVar22->Scroll).x = fVar45;
      (pIVar22->DC).CursorMaxPos.x = (fVar41 + fVar44) - fVar45;
      pIVar16->NavMoveFromClampedRefRect = true;
    }
    if ((fVar37 != 0.0) || (NAN(fVar37))) {
      fVar44 = (pIVar22->Scroll).y;
      fVar37 = (float)(int)(fVar37 * fVar36 + fVar44);
      fVar36 = (pIVar22->DC).CursorMaxPos.y;
      (pIVar22->Scroll).y = fVar37;
      (pIVar22->DC).CursorMaxPos.y = (fVar44 + fVar36) - fVar37;
      pIVar16->NavMoveFromClampedRefRect = true;
    }
  }
  (pIVar16->NavMoveResultLocal).ID = 0;
  (pIVar16->NavMoveResultLocal).ParentID = 0;
  (pIVar16->NavMoveResultLocal).Window = (ImGuiWindow *)0x0;
  (pIVar16->NavMoveResultLocal).DistAxial = 3.4028235e+38;
  (pIVar16->NavMoveResultLocal).DistBox = 3.4028235e+38;
  (pIVar16->NavMoveResultLocal).DistCenter = 3.4028235e+38;
  (pIVar16->NavMoveResultLocal).RectRel.Min.x = 3.4028235e+38;
  (pIVar16->NavMoveResultLocal).RectRel.Min.y = 3.4028235e+38;
  (pIVar16->NavMoveResultLocal).RectRel.Max.x = -3.4028235e+38;
  (pIVar16->NavMoveResultLocal).RectRel.Max.y = -3.4028235e+38;
  (pIVar16->NavMoveResultOther).ID = 0;
  (pIVar16->NavMoveResultOther).ParentID = 0;
  (pIVar16->NavMoveResultOther).Window = (ImGuiWindow *)0x0;
  (pIVar16->NavMoveResultOther).DistAxial = 3.4028235e+38;
  (pIVar16->NavMoveResultOther).DistBox = 3.4028235e+38;
  (pIVar16->NavMoveResultOther).DistCenter = 3.4028235e+38;
  (pIVar16->NavMoveResultOther).RectRel.Min.x = 3.4028235e+38;
  (pIVar16->NavMoveResultOther).RectRel.Min.y = 3.4028235e+38;
  (pIVar16->NavMoveResultOther).RectRel.Max.x = -3.4028235e+38;
  (pIVar16->NavMoveResultOther).RectRel.Max.y = -3.4028235e+38;
  if (((bVar32 != false) && (pIVar16->NavMoveFromClampedRefRect == true)) &&
     (pIVar16->NavLayer == 0)) {
    fVar36 = (pIVar22->Pos).x;
    fVar44 = (pIVar22->Pos).y;
    fVar45 = ((pIVar22->InnerMainRect).Min.x - fVar36) + -1.0;
    fVar41 = ((pIVar22->InnerMainRect).Min.y - fVar44) + -1.0;
    fVar37 = ((pIVar22->InnerMainRect).Max.x - fVar36) + 1.0;
    fVar44 = ((pIVar22->InnerMainRect).Max.y - fVar44) + 1.0;
    fVar36 = pIVar22->NavRectRel[0].Min.x;
    if ((((fVar36 < fVar45) || (pIVar22->NavRectRel[0].Min.y < fVar41)) ||
        (fVar37 < pIVar22->NavRectRel[0].Max.x)) || (fVar44 < pIVar22->NavRectRel[0].Max.y)) {
      fVar47 = pIVar17->FontBaseSize * pIVar22->FontWindowScale * 0.5;
      fVar42 = fVar37 - fVar45;
      if (fVar47 <= fVar37 - fVar45) {
        fVar42 = fVar47;
      }
      fVar49 = fVar44 - fVar41;
      if (fVar47 <= fVar44 - fVar41) {
        fVar49 = fVar47;
      }
      uVar34 = -(uint)(fVar45 + fVar42 <= fVar36);
      fVar47 = pIVar22->NavRectRel[0].Min.y;
      fVar46 = pIVar22->NavRectRel[0].Max.x;
      uVar35 = -(uint)(fVar41 + fVar49 <= fVar47);
      IVar48.y = (float)(uVar35 & (uint)fVar47 | ~uVar35 & (uint)(fVar41 + fVar49));
      IVar48.x = (float)(uVar34 & (uint)fVar36 | ~uVar34 & (uint)(fVar45 + fVar42));
      pIVar22->NavRectRel[0].Min = IVar48;
      if (fVar37 - fVar42 <= fVar46) {
        fVar46 = fVar37 - fVar42;
      }
      fVar36 = pIVar22->NavRectRel[0].Max.y;
      if (fVar44 - fVar49 <= fVar36) {
        fVar36 = fVar44 - fVar49;
      }
      IVar14.y = fVar36;
      IVar14.x = fVar46;
      pIVar22->NavRectRel[0].Max = IVar14;
      pIVar16->NavId = 0;
    }
    pIVar16->NavMoveFromClampedRefRect = false;
  }
  pIVar22 = pIVar16->NavWindow;
  if (pIVar22 == (ImGuiWindow *)0x0) {
LAB_00142614:
    fVar41 = 0.0;
    fVar44 = 0.0;
    fVar37 = 0.0;
    fVar36 = 0.0;
  }
  else {
    iVar26 = pIVar16->NavLayer;
    fVar36 = pIVar22->NavRectRel[iVar26].Min.x;
    fVar44 = pIVar22->NavRectRel[iVar26].Max.x;
    if (fVar44 < fVar36) goto LAB_00142614;
    fVar37 = pIVar22->NavRectRel[iVar26].Min.y;
    fVar41 = pIVar22->NavRectRel[iVar26].Max.y;
    if (fVar41 < fVar37) goto LAB_00142614;
  }
  if (pIVar22 == (ImGuiWindow *)0x0) {
    fVar36 = (GImGui->IO).DisplayVisibleMin.x;
    pIVar3 = &(GImGui->IO).DisplayVisibleMax;
    if ((fVar36 != pIVar3->x) || (NAN(fVar36) || NAN(pIVar3->x))) {
      fVar36 = (GImGui->IO).DisplayVisibleMin.y;
      pfVar4 = &(GImGui->IO).DisplayVisibleMax.y;
      if ((fVar36 != *pfVar4) || (NAN(fVar36) || NAN(*pfVar4))) {
        IVar43 = (GImGui->IO).DisplayVisibleMin;
        IVar39 = (GImGui->IO).DisplayVisibleMax;
        goto LAB_00142727;
      }
    }
    IVar39 = (GImGui->IO).DisplaySize;
    IVar43.x = 0.0;
    IVar43.y = 0.0;
  }
  else {
    fVar45 = (pIVar22->Pos).x;
    fVar42 = (pIVar22->Pos).y;
    IVar43.x = fVar36 + fVar45;
    IVar43.y = fVar37 + fVar42;
    IVar39.x = fVar44 + fVar45;
    IVar39.y = fVar41 + fVar42;
  }
LAB_00142727:
  (pIVar16->NavScoringRectScreen).Min = IVar43;
  (pIVar16->NavScoringRectScreen).Max = IVar39;
  fVar37 = (pIVar16->NavScoringRectScreen).Min.x + 1.0;
  fVar36 = (pIVar16->NavScoringRectScreen).Min.y;
  fVar44 = (pIVar16->NavScoringRectScreen).Max.x;
  if (fVar44 <= fVar37) {
    fVar37 = fVar44;
  }
  (pIVar16->NavScoringRectScreen).Min.x = fVar37;
  (pIVar16->NavScoringRectScreen).Max.x = fVar37;
  pfVar4 = &(pIVar16->NavScoringRectScreen).Max.y;
  if (*pfVar4 <= fVar36 && fVar36 != *pfVar4) {
    __assert_fail("!g.NavScoringRectScreen.IsInverted()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xcf9,"void ImGui::NavUpdate()");
  }
  pIVar16->NavScoringCount = 0;
  pIVar16 = GImGui;
  fVar36 = (GImGui->IO).MousePos.x;
  if (((fVar36 < -256000.0) || (fVar44 = (GImGui->IO).MousePos.y, fVar44 < -256000.0)) ||
     ((fVar37 = (GImGui->IO).MousePosPrev.x, fVar37 < -256000.0 ||
      (fVar41 = (GImGui->IO).MousePosPrev.y, fVar41 < -256000.0)))) {
    (pIVar16->IO).MouseDelta.x = 0.0;
    (pIVar16->IO).MouseDelta.y = 0.0;
  }
  else {
    IVar40.x = fVar36 - fVar37;
    IVar40.y = fVar44 - fVar41;
    (GImGui->IO).MouseDelta = IVar40;
  }
  if ((((pIVar16->IO).MouseDelta.x != 0.0) || (fVar36 = (pIVar16->IO).MouseDelta.y, fVar36 != 0.0))
     || (NAN(fVar36))) {
    pIVar16->NavDisableMouseHover = false;
  }
  IVar38 = (pIVar16->IO).MousePos;
  (pIVar16->IO).MousePosPrev = IVar38;
  lVar21 = 0x40a;
  do {
    cVar5 = *(char *)((long)pIVar16 + lVar21 + -0x2fa);
    if (cVar5 == '\x01') {
      pfVar4 = (float *)((long)pIVar16 + lVar21 * 4 + -0xc14);
      bVar32 = *pfVar4 <= 0.0 && *pfVar4 != 0.0;
    }
    else {
      bVar32 = false;
    }
    *(bool *)((long)(pIVar16->IO).KeyMap + lVar21 + -0x46) = bVar32;
    if (cVar5 == '\0') {
      bVar18 = 0.0 <= *(float *)((long)pIVar16 + lVar21 * 4 + -0xc14);
    }
    else {
      bVar18 = false;
    }
    *(bool *)((long)(pIVar16->IO).KeyMap + lVar21 + -0x3c) = bVar18;
    fVar36 = *(float *)((long)pIVar16 + lVar21 * 4 + -0xc14);
    *(float *)((long)pIVar16 + lVar21 * 4 + -0xc00) = fVar36;
    fVar44 = -1.0;
    if ((cVar5 != '\0') && (fVar44 = 0.0, 0.0 <= fVar36)) {
      fVar44 = fVar36 + (pIVar16->IO).DeltaTime;
    }
    *(float *)((long)pIVar16 + lVar21 * 4 + -0xc14) = fVar44;
    *(undefined1 *)((long)(pIVar16->IO).KeyMap + lVar21 + -0x41) = 0;
    if (bVar32 == false) {
      if (cVar5 != '\0') {
        fVar44 = (pIVar16->IO).MousePos.x - *(float *)((long)pIVar16 + lVar21 * 8 + -0x1c8c);
        fVar37 = (pIVar16->IO).MousePos.y - *(float *)((long)pIVar16 + lVar21 * 8 + -0x1c88);
        fVar36 = -fVar44;
        if (-fVar44 <= fVar44) {
          fVar36 = fVar44;
        }
        fVar41 = *(float *)((long)pIVar16 + lVar21 * 8 + -0x1c14);
        fVar45 = *(float *)((long)pIVar16 + lVar21 * 8 + -0x1c10);
        uVar34 = -(uint)(fVar36 <= fVar41);
        *(uint *)((long)pIVar16 + lVar21 * 8 + -0x1c14) =
             uVar34 & (uint)fVar41 | ~uVar34 & (uint)fVar36;
        fVar36 = -fVar37;
        if (-fVar37 <= fVar37) {
          fVar36 = fVar37;
        }
        uVar34 = -(uint)(fVar36 <= fVar45);
        *(uint *)((long)pIVar16 + lVar21 * 8 + -0x1c10) =
             uVar34 & (uint)fVar45 | ~uVar34 & (uint)fVar36;
        fVar36 = *(float *)((long)pIVar16 + lVar21 * 4 + -0xbc4);
        fVar44 = fVar44 * fVar44 + fVar37 * fVar37;
        uVar34 = -(uint)(fVar44 <= fVar36);
        *(uint *)((long)pIVar16 + lVar21 * 4 + -0xbc4) =
             uVar34 & (uint)fVar36 | ~uVar34 & (uint)fVar44;
      }
    }
    else {
      fVar36 = pIVar16->Time;
      if ((fVar36 - *(float *)((long)pIVar16 + lVar21 * 4 + -0xc3c) <
           (pIVar16->IO).MouseDoubleClickTime) &&
         (fVar37 = (pIVar16->IO).MousePos.x - *(float *)((long)pIVar16 + lVar21 * 8 + -0x1c8c),
         fVar41 = (pIVar16->IO).MousePos.y - *(float *)((long)pIVar16 + lVar21 * 8 + -0x1c88),
         fVar44 = (pIVar16->IO).MouseDoubleClickMaxDist, fVar36 = -3.4028235e+38,
         fVar37 * fVar37 + fVar41 * fVar41 < fVar44 * fVar44)) {
        *(undefined1 *)((long)(pIVar16->IO).KeyMap + lVar21 + -0x41) = 1;
        fVar36 = -3.4028235e+38;
      }
      *(float *)((long)pIVar16 + lVar21 * 4 + -0xc3c) = fVar36;
      *(ImVec2 *)((long)pIVar16 + lVar21 * 8 + -0x1c8c) = IVar38;
      *(undefined8 *)((long)pIVar16 + lVar21 * 8 + -0x1c14) = 0;
      *(undefined4 *)((long)pIVar16 + lVar21 * 4 + -0xbc4) = 0;
    }
    if (*(char *)((long)(pIVar16->IO).KeyMap + lVar21 + -0x46) == '\x01') {
      pIVar16->NavDisableMouseHover = false;
    }
    lVar21 = lVar21 + 1;
  } while (lVar21 != 0x40f);
  fVar36 = (pIVar15->IO).DeltaTime;
  iVar26 = pIVar15->FramerateSecPerFrameIdx;
  pIVar15->FramerateSecPerFrameAccum =
       (fVar36 - pIVar15->FramerateSecPerFrame[iVar26]) + pIVar15->FramerateSecPerFrameAccum;
  pIVar15->FramerateSecPerFrame[iVar26] = fVar36;
  iVar20 = iVar26 + (int)((ulong)((long)(iVar26 + 1) * -0x77777777) >> 0x20) + 1;
  pIVar15->FramerateSecPerFrameIdx = iVar26 + 1 + ((iVar20 >> 6) - (iVar20 >> 0x1f)) * -0x78;
  uVar34 = -(uint)(0.0 < pIVar15->FramerateSecPerFrameAccum);
  (pIVar15->IO).Framerate =
       (float)(~uVar34 & 0x7f7fffff |
              (uint)(1.0 / (pIVar15->FramerateSecPerFrameAccum / 120.0)) & uVar34);
  pIVar16 = GImGui;
  ppIVar12 = &GImGui->MovingWindow;
  if (*ppIVar12 == (ImGuiWindow *)0x0) {
    if (((GImGui->ActiveIdWindow != (ImGuiWindow *)0x0) &&
        (IVar6 = GImGui->ActiveId, GImGui->ActiveIdWindow->MoveId == IVar6)) &&
       (GImGui->ActiveIdIsAlive = true, (pIVar16->IO).MouseDown[0] == false)) {
      pIVar16->ActiveIdIsJustActivated = IVar6 != 0;
      if (IVar6 != 0) {
        pIVar16->ActiveIdTimer = 0.0;
      }
      pIVar16->ActiveId = 0;
      pIVar16->ActiveIdAllowNavDirFlags = 0;
      pIVar16->ActiveIdAllowOverlap = false;
      pIVar16->ActiveIdWindow = (ImGuiWindow *)0x0;
    }
    goto LAB_00142cd4;
  }
  pIVar1 = &GImGui->ActiveId;
  GImGui->ActiveIdIsAlive = true;
  pIVar22 = (*ppIVar12)->RootWindow;
  if (pIVar22 == (ImGuiWindow *)0x0) {
    __assert_fail("g.MovingWindow && g.MovingWindow->RootWindow",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.cpp"
                  ,0xd0a,"void ImGui::UpdateMovingWindow()");
  }
  if ((((pIVar16->IO).MouseDown[0] != true) ||
      (fVar36 = (pIVar16->IO).MousePos.x, fVar36 < -256000.0)) ||
     (fVar44 = (pIVar16->IO).MousePos.y, fVar44 < -256000.0)) {
    bVar32 = *pIVar1 != 0;
    pIVar16->ActiveIdIsJustActivated = bVar32;
    if (bVar32) {
      pIVar16->ActiveIdTimer = 0.0;
    }
    pIVar16->ActiveId = 0;
    pIVar16->ActiveIdAllowNavDirFlags = 0;
    pIVar16->ActiveIdAllowOverlap = false;
    pIVar16->ActiveIdWindow = (ImGuiWindow *)0x0;
    pIVar16->MovingWindow = (ImGuiWindow *)0x0;
    goto LAB_00142cd4;
  }
  local_48.Min.x = fVar36 - (pIVar16->ActiveIdClickOffset).x;
  fVar44 = fVar44 - (pIVar16->ActiveIdClickOffset).y;
  local_48.Min.y = fVar44;
  fVar36 = (pIVar22->Pos).x;
  if ((fVar36 != local_48.Min.x) || (NAN(fVar36) || NAN(local_48.Min.x))) {
LAB_00142c9a:
    if (((pIVar22->Flags & 0x100) == 0) && (pIVar16->SettingsDirtyTimer <= 0.0)) {
      pIVar16->SettingsDirtyTimer = (pIVar16->IO).IniSavingRate;
    }
    ::SetWindowPos(pIVar22,&local_48.Min,1);
  }
  else {
    fVar36 = (pIVar22->Pos).y;
    if ((fVar36 != fVar44) || (NAN(fVar36) || NAN(fVar44))) goto LAB_00142c9a;
  }
  FocusWindow(pIVar16->MovingWindow);
LAB_00142cd4:
  NewFrameUpdateHoveredWindowAndCaptureFlags();
  pIVar22 = GetFrontMostPopupModal();
  if (pIVar22 == (ImGuiWindow *)0x0) {
    fVar36 = 0.0;
  }
  else {
    fVar36 = (pIVar15->IO).DeltaTime * 6.0 + pIVar15->ModalWindowDarkeningRatio;
    if (1.0 <= fVar36) {
      fVar36 = 1.0;
    }
  }
  pIVar15->ModalWindowDarkeningRatio = fVar36;
  pIVar15->MouseCursor = 0;
  pIVar15->WantTextInputNextFrame = -1;
  pIVar15->WantCaptureMouseNextFrame = -1;
  pIVar15->WantCaptureKeyboardNextFrame = -1;
  (pIVar15->PlatformImePos).x = 1.0;
  (pIVar15->PlatformImePos).y = 1.0;
  pIVar22 = pIVar15->HoveredWindow;
  if (((pIVar22 != (ImGuiWindow *)0x0) && (pIVar22->Collapsed == false)) &&
     ((fVar36 = (pIVar15->IO).MouseWheel, pIVar24 = pIVar22, fVar36 != 0.0 ||
      ((fVar44 = (pIVar15->IO).MouseWheelH, fVar44 != 0.0 || (NAN(fVar44))))))) {
    do {
      pIVar29 = pIVar24;
      uVar34 = pIVar29->Flags;
      if ((uVar34 & 0x1000218) != 0x1000010) break;
      pIVar24 = pIVar29->ParentWindow;
    } while (pIVar29->ParentWindow != (ImGuiWindow *)0x0);
    if ((fVar36 != 0.0) || (NAN(fVar36))) {
      bVar32 = (pIVar15->IO).KeyCtrl;
      if ((bVar32 == true) && ((pIVar15->IO).FontAllowUserScaling == true)) {
        fVar44 = fVar36 * 0.1 + pIVar22->FontWindowScale;
        fVar36 = 2.5;
        if (fVar44 <= 2.5) {
          fVar36 = fVar44;
        }
        fVar36 = (float)(-(uint)(fVar44 < 0.5) & 0x3f000000 | ~-(uint)(fVar44 < 0.5) & (uint)fVar36)
        ;
        fVar42 = fVar36 / pIVar22->FontWindowScale;
        pIVar22->FontWindowScale = fVar36;
        fVar36 = (pIVar22->Size).x;
        fVar44 = (pIVar22->Size).y;
        fVar37 = (pIVar15->IO).MousePos.y;
        fVar41 = (pIVar22->Pos).x;
        fVar45 = (pIVar22->Pos).y;
        (pIVar22->Pos).x =
             (((pIVar15->IO).MousePos.x - fVar41) * fVar36 * (1.0 - fVar42)) / fVar36 + fVar41;
        (pIVar22->Pos).y = ((fVar37 - fVar45) * (1.0 - fVar42) * fVar44) / fVar44 + fVar45;
        (pIVar22->Size).x = fVar36 * fVar42;
        (pIVar22->Size).y = fVar44 * fVar42;
        (pIVar22->SizeFull).x = (pIVar22->SizeFull).x * fVar42;
        (pIVar22->SizeFull).y = fVar42 * (pIVar22->SizeFull).y;
      }
      else if ((uVar34 & 0x210) == 0 && bVar32 == false) {
        fVar37 = GImGui->FontBaseSize * pIVar29->FontWindowScale * 5.0;
        fVar44 = (pIVar29->WindowPadding).y;
        fVar41 = (fVar44 + fVar44 +
                 ((pIVar29->ContentsRegionRect).Max.y - (pIVar29->ContentsRegionRect).Min.y)) * 0.67
        ;
        fVar44 = (pIVar29->Scroll).y;
        if (fVar41 <= fVar37) {
          fVar37 = fVar41;
        }
        fVar41 = (pIVar29->DC).CursorMaxPos.y;
        fVar36 = fVar44 - fVar36 * (float)(int)fVar37;
        (pIVar29->Scroll).y = fVar36;
        (pIVar29->DC).CursorMaxPos.y = (fVar44 + fVar41) - fVar36;
      }
    }
    if ((uVar34 & 0x210) == 0) {
      fVar36 = (pIVar15->IO).MouseWheelH;
      if ((((fVar36 != 0.0) || (NAN(fVar36))) && ((pIVar15->IO).KeyCtrl == false)) &&
         ((pIVar22->Flags & 0x10) == 0)) {
        fVar44 = (pIVar22->Scroll).x;
        fVar37 = (pIVar22->DC).CursorMaxPos.x;
        fVar36 = fVar44 - fVar36 * GImGui->FontBaseSize * pIVar29->FontWindowScale;
        (pIVar22->Scroll).x = fVar36;
        (pIVar22->DC).CursorMaxPos.x = (fVar44 + fVar37) - fVar36;
      }
    }
  }
  if (((((pIVar15->ActiveId == 0) && (pIVar22 = pIVar15->NavWindow, pIVar22 != (ImGuiWindow *)0x0))
       && ((pIVar22->Active == true &&
           (((pIVar22->Flags & 0x40000) == 0 && ((pIVar15->IO).KeyCtrl == false)))))) &&
      (iVar26 = (GImGui->IO).KeyMap[0], -1 < iVar26)) &&
     (bVar32 = IsKeyPressed(iVar26,false), bVar32)) {
    if ((pIVar15->NavId == 0) || (pIVar15->NavIdTabCounter == 0x7fffffff)) {
      iVar26 = -(uint)(pIVar15->IO).KeyShift;
    }
    else {
      iVar26 = pIVar15->NavIdTabCounter + (-(uint)(pIVar15->IO).KeyShift | 1) + 1;
    }
    pIVar15->NavWindow->FocusIdxTabRequestNext = iVar26;
  }
  pIVar15->NavIdTabCounter = 0x7fffffff;
  uVar34 = (pIVar15->Windows).Size;
  if ((ulong)uVar34 != 0) {
    uVar25 = 0;
    if (0 < (int)uVar34) {
      uVar25 = (ulong)uVar34;
    }
    uVar28 = 0;
    do {
      if (uVar25 == uVar28) {
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                      ,0x4c0,
                      "value_type &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
      }
      pIVar22 = (pIVar15->Windows).Data[uVar28];
      pIVar22->WasActive = pIVar22->Active;
      pIVar22->Active = false;
      pIVar22->WriteAccessed = false;
      uVar28 = uVar28 + 1;
    } while (uVar34 != uVar28);
  }
  if ((pIVar15->NavWindow != (ImGuiWindow *)0x0) && (pIVar15->NavWindow->WasActive == false)) {
    FocusFrontMostActiveWindow((ImGuiWindow *)0x0);
  }
  iVar26 = (pIVar15->CurrentWindowStack).Capacity;
  if (iVar26 < 0) {
    uVar34 = iVar26 / 2 + iVar26;
    uVar25 = 0;
    if (0 < (int)uVar34) {
      uVar25 = (ulong)uVar34;
    }
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
    __dest = (ImGuiWindow **)(*GImAllocatorAllocFunc)(uVar25 * 8,GImAllocatorUserData);
    ppIVar12 = (pIVar15->CurrentWindowStack).Data;
    if (ppIVar12 != (ImGuiWindow **)0x0) {
      memcpy(__dest,ppIVar12,(long)(pIVar15->CurrentWindowStack).Size << 3);
      ppIVar12 = (pIVar15->CurrentWindowStack).Data;
      if (ppIVar12 != (ImGuiWindow **)0x0) {
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      }
      (*GImAllocatorFreeFunc)(ppIVar12,GImAllocatorUserData);
    }
    (pIVar15->CurrentWindowStack).Data = __dest;
    (pIVar15->CurrentWindowStack).Capacity = (int)uVar25;
  }
  (pIVar15->CurrentWindowStack).Size = 0;
  iVar26 = (pIVar15->CurrentPopupStack).Capacity;
  if (iVar26 < 0) {
    uVar34 = iVar26 / 2 + iVar26;
    uVar25 = 0;
    if (0 < (int)uVar34) {
      uVar25 = (ulong)uVar34;
    }
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
    __dest_00 = (ImGuiPopupRef *)(*GImAllocatorAllocFunc)(uVar25 * 0x30,GImAllocatorUserData);
    pIVar13 = (pIVar15->CurrentPopupStack).Data;
    if (pIVar13 != (ImGuiPopupRef *)0x0) {
      memcpy(__dest_00,pIVar13,(long)(pIVar15->CurrentPopupStack).Size * 0x30);
      pIVar13 = (pIVar15->CurrentPopupStack).Data;
      if (pIVar13 != (ImGuiPopupRef *)0x0) {
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      }
      (*GImAllocatorFreeFunc)(pIVar13,GImAllocatorUserData);
    }
    (pIVar15->CurrentPopupStack).Data = __dest_00;
    (pIVar15->CurrentPopupStack).Capacity = (int)uVar25;
  }
  (pIVar15->CurrentPopupStack).Size = 0;
  ClosePopupsOverWindow(pIVar15->NavWindow);
  pIVar15 = GImGui;
  (pIVar15->NextWindowData).SizeVal.x = 400.0;
  (pIVar15->NextWindowData).SizeVal.y = 400.0;
  (pIVar15->NextWindowData).SizeCond = 4;
  Begin("Debug##Default",(bool *)0x0,0);
  return;
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() or ImGui::SetCurrentContext()?");
    ImGuiContext& g = *GImGui;

    // Check user data
    // (We pass an error message in the assert expression to make it visible to programmers who are not using a debugger, as most assert handlers display their argument)
    IM_ASSERT(g.Initialized);
    IM_ASSERT(g.IO.DeltaTime >= 0.0f                                    && "Need a positive DeltaTime (zero is tolerated but will cause some timing issues)");
    IM_ASSERT(g.IO.DisplaySize.x >= 0.0f && g.IO.DisplaySize.y >= 0.0f  && "Invalid DisplaySize value");
    IM_ASSERT(g.IO.Fonts->Fonts.Size > 0                                && "Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?");
    IM_ASSERT(g.IO.Fonts->Fonts[0]->IsLoaded()                          && "Font Atlas not built. Did you call io.Fonts->GetTexDataAsRGBA32() / GetTexDataAsAlpha8() ?");
    IM_ASSERT(g.Style.CurveTessellationTol > 0.0f                       && "Invalid style setting");
    IM_ASSERT(g.Style.Alpha >= 0.0f && g.Style.Alpha <= 1.0f            && "Invalid style setting. Alpha cannot be negative (allows us to avoid a few clamps in color computations)");
    IM_ASSERT((g.FrameCount == 0 || g.FrameCountEnded == g.FrameCount)  && "Forgot to call Render() or EndFrame() at the end of the previous frame?");
    for (int n = 0; n < ImGuiKey_COUNT; n++)
        IM_ASSERT(g.IO.KeyMap[n] >= -1 && g.IO.KeyMap[n] < IM_ARRAYSIZE(g.IO.KeysDown) && "io.KeyMap[] contains an out of bound value (need to be 0..512, or -1 for unmapped key)");

    // Perform simple check for required key mapping (we intentionally do NOT check all keys to not pressure user into setting up everything, but Space is required and was only recently added in 1.60 WIP)
    if (g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard)
        IM_ASSERT(g.IO.KeyMap[ImGuiKey_Space] != -1 && "ImGuiKey_Space is not mapped, required for keyboard navigation.");

    // Load settings on first frame (if not explicitly loaded manually before)
    if (!g.SettingsLoaded)
    {
        IM_ASSERT(g.SettingsWindows.empty());
        if (g.IO.IniFilename)
            LoadIniSettingsFromDisk(g.IO.IniFilename);
        g.SettingsLoaded = true;
    }

    // Save settings (with a delay after the last modification, so we don't spam disk too much)
    if (g.SettingsDirtyTimer > 0.0f)
    {
        g.SettingsDirtyTimer -= g.IO.DeltaTime;
        if (g.SettingsDirtyTimer <= 0.0f)
        {
            if (g.IO.IniFilename != NULL)
                SaveIniSettingsToDisk(g.IO.IniFilename);
            else
                g.IO.WantSaveIniSettings = true;  // Let user know they can call SaveIniSettingsToMemory(). user will need to clear io.WantSaveIniSettings themselves.
            g.SettingsDirtyTimer = 0.0f;
        }
    }

    g.Time += g.IO.DeltaTime;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;

    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    g.DrawListSharedData.ClipRectFullscreen = ImVec4(0.0f, 0.0f, g.IO.DisplaySize.x, g.IO.DisplaySize.y);
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;

    g.OverlayDrawList.Clear();
    g.OverlayDrawList.PushTextureID(g.IO.Fonts->TexID);
    g.OverlayDrawList.PushClipRectFullScreen();
    g.OverlayDrawList.Flags = (g.Style.AntiAliasedLines ? ImDrawListFlags_AntiAliasedLines : 0) | (g.Style.AntiAliasedFill ? ImDrawListFlags_AntiAliasedFill : 0);

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it
    g.DrawData.Clear();

    // Clear reference to active widget if the widget isn't alive anymore
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    if (!g.ActiveIdIsAlive && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.ScalarAsInputTextId && g.ActiveId != g.ScalarAsInputTextId)
        g.ScalarAsInputTextId = 0;

    // Elapse drag & drop payload
    if (g.DragDropActive && g.DragDropPayload.DataFrameCount + 1 < g.FrameCount)
    {
        ClearDragDrop();
        g.DragDropPayloadBufHeap.clear();
        memset(&g.DragDropPayloadBufLocal, 0, sizeof(g.DragDropPayloadBufLocal));
    }
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;

    // Update keyboard input state
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard directional navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame))) : FLT_MAX;

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMovingWindow();
    NewFrameUpdateHoveredWindowAndCaptureFlags();

    if (GetFrontMostPopupModal() != NULL)
        g.ModalWindowDarkeningRatio = ImMin(g.ModalWindowDarkeningRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.ModalWindowDarkeningRatio = 0.0f;

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // Mouse wheel scrolling, scale
    if (g.HoveredWindow && !g.HoveredWindow->Collapsed && (g.IO.MouseWheel != 0.0f || g.IO.MouseWheelH != 0.0f))
    {
        // If a child window has the ImGuiWindowFlags_NoScrollWithMouse flag, we give a chance to scroll its parent (unless either ImGuiWindowFlags_NoInputs or ImGuiWindowFlags_NoScrollbar are also set).
        ImGuiWindow* window = g.HoveredWindow;
        ImGuiWindow* scroll_window = window;
        while ((scroll_window->Flags & ImGuiWindowFlags_ChildWindow) && (scroll_window->Flags & ImGuiWindowFlags_NoScrollWithMouse) && !(scroll_window->Flags & ImGuiWindowFlags_NoScrollbar) && !(scroll_window->Flags & ImGuiWindowFlags_NoInputs) && scroll_window->ParentWindow)
            scroll_window = scroll_window->ParentWindow;
        const bool scroll_allowed = !(scroll_window->Flags & ImGuiWindowFlags_NoScrollWithMouse) && !(scroll_window->Flags & ImGuiWindowFlags_NoInputs);

        if (g.IO.MouseWheel != 0.0f)
        {
            if (g.IO.KeyCtrl && g.IO.FontAllowUserScaling)
            {
                // Zoom / Scale window
                const float new_font_scale = ImClamp(window->FontWindowScale + g.IO.MouseWheel * 0.10f, 0.50f, 2.50f);
                const float scale = new_font_scale / window->FontWindowScale;
                window->FontWindowScale = new_font_scale;

                const ImVec2 offset = window->Size * (1.0f - scale) * (g.IO.MousePos - window->Pos) / window->Size;
                window->Pos += offset;
                window->Size *= scale;
                window->SizeFull *= scale;
            }
            else if (!g.IO.KeyCtrl && scroll_allowed)
            {
                // Mouse wheel vertical scrolling
                float scroll_amount = 5 * scroll_window->CalcFontSize();
                scroll_amount = (float)(int)ImMin(scroll_amount, (scroll_window->ContentsRegionRect.GetHeight() + scroll_window->WindowPadding.y * 2.0f) * 0.67f);
                SetWindowScrollY(scroll_window, scroll_window->Scroll.y - g.IO.MouseWheel * scroll_amount);
            }
        }
        if (g.IO.MouseWheelH != 0.0f && scroll_allowed)
        {
            // Mouse wheel horizontal scrolling (for hardware that supports it)
            float scroll_amount = scroll_window->CalcFontSize();
            if (!g.IO.KeyCtrl && !(window->Flags & ImGuiWindowFlags_NoScrollWithMouse))
                SetWindowScrollX(window, window->Scroll.x - g.IO.MouseWheelH * scroll_amount);
        }
    }

    // Pressing TAB activate widget focus
    if (g.ActiveId == 0 && g.NavWindow != NULL && g.NavWindow->Active && !(g.NavWindow->Flags & ImGuiWindowFlags_NoNavInputs) && !g.IO.KeyCtrl && IsKeyPressedMap(ImGuiKey_Tab, false))
    {
        if (g.NavId != 0 && g.NavIdTabCounter != INT_MAX)
            g.NavWindow->FocusIdxTabRequestNext = g.NavIdTabCounter + 1 + (g.IO.KeyShift ? -1 : 1);
        else
            g.NavWindow->FocusIdxTabRequestNext = g.IO.KeyShift ? -1 : 0;
    }
    g.NavIdTabCounter = INT_MAX;

    // Mark all windows as not visible
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->Active = false;
        window->WriteAccessed = false;
    }

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusFrontMostActiveWindow(NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.CurrentPopupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow);

    // Create implicit window - we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    SetNextWindowSize(ImVec2(400,400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
}